

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O0

Scale * __thiscall icu_63::number::Scale::operator=(Scale *this,Scale *other)

{
  DecNum *this_00;
  DecNum *local_50;
  UErrorCode local_1c;
  Scale *pSStack_18;
  UErrorCode localStatus;
  Scale *other_local;
  Scale *this_local;
  
  this->fMagnitude = other->fMagnitude;
  pSStack_18 = other;
  if (other->fArbitrary == (DecNum *)0x0) {
    this->fArbitrary = (DecNum *)0x0;
  }
  else {
    local_1c = U_ZERO_ERROR;
    other_local = this;
    this_00 = (DecNum *)UMemory::operator_new((UMemory *)0x60,(size_t)other);
    local_50 = (DecNum *)0x0;
    if (this_00 != (DecNum *)0x0) {
      impl::DecNum::DecNum(this_00,pSStack_18->fArbitrary,&local_1c);
      local_50 = this_00;
    }
    this->fArbitrary = local_50;
  }
  this->fError = pSStack_18->fError;
  return this;
}

Assistant:

Scale& Scale::operator=(const Scale& other) {
    fMagnitude = other.fMagnitude;
    if (other.fArbitrary != nullptr) {
        UErrorCode localStatus = U_ZERO_ERROR;
        fArbitrary = new DecNum(*other.fArbitrary, localStatus);
    } else {
        fArbitrary = nullptr;
    }
    fError = other.fError;
    return *this;
}